

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::v6::internal::float_writer<char>::prettify<char*>(float_writer<char> *this,char *it)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  undefined1 *in_RSI;
  long *in_RDI;
  bool bVar4;
  int num_digits_1;
  int num_zeros_3;
  int num_zeros_2;
  int num_digits;
  int num_zeros_1;
  bool trailing_zeros;
  int num_zeros;
  int full_exp;
  uint in_stack_ffffffffffffffa8;
  uint uVar5;
  undefined1 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffad;
  undefined1 in_stack_ffffffffffffffae;
  char cVar6;
  undefined1 in_stack_ffffffffffffffaf;
  byte bVar7;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  char *local_18;
  char *local_8;
  
  iVar3 = (int)in_RDI[1] + *(int *)((long)in_RDI + 0xc);
  if ((char)*(undefined4 *)((long)in_RDI + 0x1c) == '\x01') {
    *in_RSI = *(undefined1 *)*in_RDI;
    bVar7 = 0;
    if (0 < (int)in_RDI[3] - (int)in_RDI[1]) {
      bVar7 = (byte)(*(uint *)((long)in_RDI + 0x1c) >> 0x15) & 1;
    }
    if ((1 < (int)in_RDI[1]) || (bVar7 != 0)) {
      in_RSI[1] = (char)in_RDI[4];
    }
    local_18 = copy_str<char,_const_char_*,_char_*,_0>
                         ((char *)in_RDI,
                          (char *)CONCAT17(bVar7,CONCAT16(in_stack_ffffffffffffffae,
                                                          CONCAT15(in_stack_ffffffffffffffad,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8)))),(char *)0x225d50);
    if (bVar7 != 0) {
      local_18 = std::fill_n<char*,int,char>
                           ((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc,
                            (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    cVar6 = 'E';
    if ((*(uint *)((long)in_RDI + 0x1c) & 0x10000) == 0) {
      cVar6 = 'e';
    }
    *local_18 = cVar6;
    local_8 = write_exponent<char,char*>(iVar3 + -1,local_18 + 1);
  }
  else {
    if (iVar3 < (int)in_RDI[1]) {
      if (iVar3 < 1) {
        *in_RSI = 0x30;
        iVar3 = -iVar3;
        if ((-1 < (int)in_RDI[3]) && ((int)in_RDI[3] < iVar3)) {
          iVar3 = (int)in_RDI[3];
        }
        iVar1 = (int)in_RDI[1];
        uVar5 = in_stack_ffffffffffffffa8;
        if ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) == 0) {
          while( true ) {
            uVar5 = in_stack_ffffffffffffffa8 & 0xffffff;
            if (0 < iVar1) {
              uVar5 = CONCAT13(*(char *)(*in_RDI + (long)(iVar1 + -1)) == '0',
                               (int3)in_stack_ffffffffffffffa8);
            }
            if ((char)(uVar5 >> 0x18) == '\0') break;
            iVar1 = iVar1 + -1;
            in_stack_ffffffffffffffa8 = uVar5;
          }
        }
        if ((iVar3 != 0) || (local_18 = in_RSI + 1, iVar1 != 0)) {
          in_RSI[1] = (char)in_RDI[4];
          std::fill_n<char*,int,char>
                    ((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc,(char *)CONCAT44(iVar3,iVar1));
          local_18 = copy_str<char,_const_char_*,_char_*,_0>
                               ((char *)in_RDI,
                                (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                                 CONCAT16(in_stack_ffffffffffffffae,
                                                          CONCAT15(in_stack_ffffffffffffffad,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffffac,uVar5)))),
                                (char *)0x226144);
        }
      }
      else {
        pcVar2 = copy_str<char,_const_char_*,_char_*,_0>
                           ((char *)in_RDI,
                            (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                             CONCAT16(in_stack_ffffffffffffffae,
                                                      CONCAT15(in_stack_ffffffffffffffad,
                                                               CONCAT14(in_stack_ffffffffffffffac,
                                                                        in_stack_ffffffffffffffa8)))
                                            ),(char *)0x225ef2);
        if ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) == 0) {
          iVar1 = (int)in_RDI[1];
          while( true ) {
            bVar4 = false;
            if (iVar3 < iVar1) {
              bVar4 = *(char *)(*in_RDI + (long)(iVar1 + -1)) == '0';
            }
            if (!bVar4) break;
            iVar1 = iVar1 + -1;
          }
          if (iVar1 != iVar3) {
            *pcVar2 = (char)in_RDI[4];
          }
          pcVar2 = copy_str<char,_const_char_*,_char_*,_0>
                             ((char *)in_RDI,
                              (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                               CONCAT16(in_stack_ffffffffffffffae,
                                                        CONCAT15(in_stack_ffffffffffffffad,
                                                                 (uint5)in_stack_ffffffffffffffa8)))
                              ,(char *)0x225fb0);
          return pcVar2;
        }
        *pcVar2 = (char)in_RDI[4];
        local_18 = copy_str<char,_const_char_*,_char_*,_0>
                             ((char *)in_RDI,
                              (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                               CONCAT16(in_stack_ffffffffffffffae,
                                                        CONCAT15(in_stack_ffffffffffffffad,
                                                                 CONCAT14(in_stack_ffffffffffffffac,
                                                                          in_stack_ffffffffffffffa8)
                                                                ))),(char *)0x225ff4);
        if ((int)in_RDI[1] < (int)in_RDI[3]) {
          local_18 = std::fill_n<char*,int,char>
                               ((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0
                                                ),(int)in_RDI[3] - (int)in_RDI[1],
                                (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0
                                                ));
        }
      }
    }
    else {
      copy_str<char,_const_char_*,_char_*,_0>
                ((char *)in_RDI,
                 (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                  CONCAT16(in_stack_ffffffffffffffae,
                                           CONCAT15(in_stack_ffffffffffffffad,
                                                    CONCAT14(in_stack_ffffffffffffffac,
                                                             in_stack_ffffffffffffffa8)))),
                 (char *)0x225e02);
      pcVar2 = std::fill_n<char*,int,char>
                         ((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc,
                          (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      local_18 = pcVar2;
      if ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) != 0) {
        *pcVar2 = (char)in_RDI[4];
        if ((int)in_RDI[3] - iVar3 < 1) {
          local_18 = pcVar2 + 1;
          if ((char)*(undefined4 *)((long)in_RDI + 0x1c) != '\x02') {
            local_18 = pcVar2 + 2;
            pcVar2[1] = '0';
          }
          return local_18;
        }
        local_18 = std::fill_n<char*,int,char>
                             ((char *)CONCAT44(CONCAT13(0x30,(int3)in_stack_ffffffffffffffd4),
                                               in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
                              (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))
        ;
      }
    }
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }